

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O3

void __thiscall NaLinearUnit::NaLinearUnit(NaLinearUnit *this)

{
  NaUnit::NaUnit(&this->super_NaUnit,1,1,0);
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,"LinearUnit");
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_001742c0;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaLinearUnit_00174340;
  (this->yd)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_001745b8;
  (this->yd).nItems = 0;
  (this->yd).pHead = (item *)0x0;
  (this->yd).pTail = (item *)0x0;
  this->act = false;
  this->kind = lckGain;
  this->K = 1.0;
  this->T = 0.0;
  this->Rho = 0.0;
  this->Tau = 0.0;
  return;
}

Assistant:

NaLinearUnit::NaLinearUnit ()
:   NaConfigPart("LinearUnit")
{
    act = false;
    kind = lckGain;
    K = 1.0;
    T = 0.0;
    Rho = 0.0;
    Tau = 0.0;
}